

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mersenne_twister.h
# Opt level: O1

void __thiscall
dlib::random_helpers::
mersenne_twister<unsigned_int,_32,_624,_397,_31,_2567483615U,_11,_7,_2636928640U,_15,_4022730752U,_18,_3346425566U>
::twist(mersenne_twister<unsigned_int,_32,_624,_397,_31,_2567483615U,_11,_7,_2636928640U,_15,_4022730752U,_18,_3346425566U>
        *this,int block)

{
  bool bVar1;
  undefined8 uVar2;
  byte bVar3;
  byte bVar4;
  long lVar5;
  ushort uVar6;
  ulong uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar9 [16];
  undefined1 auVar12 [16];
  
  if (block == 0) {
    lVar5 = -0x270;
    auVar8._8_4_ = 0x7ffffffe;
    auVar8._0_8_ = 0x7ffffffe7ffffffe;
    auVar8._12_4_ = 0x7ffffffe;
    auVar9._8_4_ = 0x80000000;
    auVar9._0_8_ = 0x8000000080000000;
    auVar9._12_4_ = 0x80000000;
    auVar27._8_4_ = 1;
    auVar27._0_8_ = 0x100000001;
    auVar27._12_4_ = 1;
    auVar29._8_4_ = 0x9908b0df;
    auVar29._0_8_ = 0x9908b0df9908b0df;
    auVar29._12_4_ = 0x9908b0df;
    do {
      auVar11 = vpand_avx(*(undefined1 (*) [16])(this->x + lVar5 + 0x271),auVar8);
      auVar11 = vpternlogd_avx512vl(auVar11,auVar9,*(undefined1 (*) [16])(this->x + lVar5 + 0x270),
                                    0xf8);
      auVar11 = vpsrld_avx(auVar11,1);
      auVar11 = auVar11 ^ *(undefined1 (*) [16])(this->x + lVar5 + 0x3fd);
      uVar7 = vptestmd_avx512vl(*(undefined1 (*) [16])(this->x + lVar5 + 0x271),auVar27);
      uVar7 = uVar7 & 0xf;
      auVar12 = vpxord_avx512vl(auVar11,auVar29);
      bVar1 = (bool)((byte)uVar7 & 1);
      auVar13._0_4_ = (uint)bVar1 * auVar12._0_4_ | (uint)!bVar1 * auVar11._0_4_;
      bVar1 = (bool)((byte)(uVar7 >> 1) & 1);
      auVar13._4_4_ = (uint)bVar1 * auVar12._4_4_ | (uint)!bVar1 * auVar11._4_4_;
      bVar1 = (bool)((byte)(uVar7 >> 2) & 1);
      auVar13._8_4_ = (uint)bVar1 * auVar12._8_4_ | (uint)!bVar1 * auVar11._8_4_;
      bVar1 = SUB81(uVar7 >> 3,0);
      auVar13._12_4_ = (uint)bVar1 * auVar12._12_4_ | (uint)!bVar1 * auVar11._12_4_;
      *(undefined1 (*) [16])(&this->i + lVar5) = auVar13;
      lVar5 = lVar5 + 4;
    } while (lVar5 != 0);
  }
  else if (block == 1) {
    lVar5 = 0;
    auVar14 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar15 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar16 = vpbroadcastq_avx512f(ZEXT816(0xe3));
    auVar17 = vpbroadcastd_avx512f(ZEXT416(0x7ffffffe));
    auVar18 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
    auVar19 = vpbroadcastd_avx512f(ZEXT416(1));
    auVar20 = vpbroadcastd_avx512f(ZEXT416(0x9908b0df));
    do {
      auVar21 = vpbroadcastq_avx512f();
      auVar22 = vporq_avx512f(auVar21,auVar14);
      auVar21 = vporq_avx512f(auVar21,auVar15);
      uVar2 = vpcmpuq_avx512f(auVar21,auVar16,1);
      bVar3 = (byte)uVar2;
      uVar2 = vpcmpuq_avx512f(auVar22,auVar16,1);
      bVar4 = (byte)uVar2;
      uVar6 = CONCAT11(bVar4,bVar3);
      auVar21 = vmovdqu32_avx512f(*(undefined1 (*) [64])(this->x + lVar5 + 0x270));
      auVar22._4_4_ = (uint)((byte)(uVar6 >> 1) & 1) * auVar21._4_4_;
      auVar22._0_4_ = (uint)(bVar3 & 1) * auVar21._0_4_;
      auVar22._8_4_ = (uint)((byte)(uVar6 >> 2) & 1) * auVar21._8_4_;
      auVar22._12_4_ = (uint)((byte)(uVar6 >> 3) & 1) * auVar21._12_4_;
      auVar22._16_4_ = (uint)((byte)(uVar6 >> 4) & 1) * auVar21._16_4_;
      auVar22._20_4_ = (uint)((byte)(uVar6 >> 5) & 1) * auVar21._20_4_;
      auVar22._24_4_ = (uint)((byte)(uVar6 >> 6) & 1) * auVar21._24_4_;
      auVar22._28_4_ = (uint)((byte)(uVar6 >> 7) & 1) * auVar21._28_4_;
      auVar22._32_4_ = (uint)(bVar4 & 1) * auVar21._32_4_;
      auVar22._36_4_ = (uint)(bVar4 >> 1 & 1) * auVar21._36_4_;
      auVar22._40_4_ = (uint)(bVar4 >> 2 & 1) * auVar21._40_4_;
      auVar22._44_4_ = (uint)(bVar4 >> 3 & 1) * auVar21._44_4_;
      auVar22._48_4_ = (uint)(bVar4 >> 4 & 1) * auVar21._48_4_;
      auVar22._52_4_ = (uint)(bVar4 >> 5 & 1) * auVar21._52_4_;
      auVar22._56_4_ = (uint)(bVar4 >> 6 & 1) * auVar21._56_4_;
      auVar22._60_4_ = (uint)(bVar4 >> 7) * auVar21._60_4_;
      auVar21 = vmovdqu32_avx512f(*(undefined1 (*) [64])(this->x + lVar5 + 0x271));
      auVar23._4_4_ = (uint)((byte)(uVar6 >> 1) & 1) * auVar21._4_4_;
      auVar23._0_4_ = (uint)(bVar3 & 1) * auVar21._0_4_;
      auVar23._8_4_ = (uint)((byte)(uVar6 >> 2) & 1) * auVar21._8_4_;
      auVar23._12_4_ = (uint)((byte)(uVar6 >> 3) & 1) * auVar21._12_4_;
      auVar23._16_4_ = (uint)((byte)(uVar6 >> 4) & 1) * auVar21._16_4_;
      auVar23._20_4_ = (uint)((byte)(uVar6 >> 5) & 1) * auVar21._20_4_;
      auVar23._24_4_ = (uint)((byte)(uVar6 >> 6) & 1) * auVar21._24_4_;
      auVar23._28_4_ = (uint)((byte)(uVar6 >> 7) & 1) * auVar21._28_4_;
      auVar23._32_4_ = (uint)(bVar4 & 1) * auVar21._32_4_;
      auVar23._36_4_ = (uint)(bVar4 >> 1 & 1) * auVar21._36_4_;
      auVar23._40_4_ = (uint)(bVar4 >> 2 & 1) * auVar21._40_4_;
      auVar23._44_4_ = (uint)(bVar4 >> 3 & 1) * auVar21._44_4_;
      auVar23._48_4_ = (uint)(bVar4 >> 4 & 1) * auVar21._48_4_;
      auVar23._52_4_ = (uint)(bVar4 >> 5 & 1) * auVar21._52_4_;
      auVar23._56_4_ = (uint)(bVar4 >> 6 & 1) * auVar21._56_4_;
      auVar23._60_4_ = (uint)(bVar4 >> 7) * auVar21._60_4_;
      auVar21 = vpandd_avx512f(auVar23,auVar17);
      auVar21 = vpternlogd_avx512f(auVar21,auVar22,auVar18,0xf8);
      auVar22 = vmovdqu32_avx512f(*(undefined1 (*) [64])(this->x + lVar5 + 0x3fd));
      auVar24._4_4_ = (uint)((byte)(uVar6 >> 1) & 1) * auVar22._4_4_;
      auVar24._0_4_ = (uint)(bVar3 & 1) * auVar22._0_4_;
      auVar24._8_4_ = (uint)((byte)(uVar6 >> 2) & 1) * auVar22._8_4_;
      auVar24._12_4_ = (uint)((byte)(uVar6 >> 3) & 1) * auVar22._12_4_;
      auVar24._16_4_ = (uint)((byte)(uVar6 >> 4) & 1) * auVar22._16_4_;
      auVar24._20_4_ = (uint)((byte)(uVar6 >> 5) & 1) * auVar22._20_4_;
      auVar24._24_4_ = (uint)((byte)(uVar6 >> 6) & 1) * auVar22._24_4_;
      auVar24._28_4_ = (uint)((byte)(uVar6 >> 7) & 1) * auVar22._28_4_;
      auVar24._32_4_ = (uint)(bVar4 & 1) * auVar22._32_4_;
      auVar24._36_4_ = (uint)(bVar4 >> 1 & 1) * auVar22._36_4_;
      auVar24._40_4_ = (uint)(bVar4 >> 2 & 1) * auVar22._40_4_;
      auVar24._44_4_ = (uint)(bVar4 >> 3 & 1) * auVar22._44_4_;
      auVar24._48_4_ = (uint)(bVar4 >> 4 & 1) * auVar22._48_4_;
      auVar24._52_4_ = (uint)(bVar4 >> 5 & 1) * auVar22._52_4_;
      auVar24._56_4_ = (uint)(bVar4 >> 6 & 1) * auVar22._56_4_;
      auVar24._60_4_ = (uint)(bVar4 >> 7) * auVar22._60_4_;
      auVar21 = vpsrld_avx512f(auVar21,1);
      auVar21 = vpxord_avx512f(auVar21,auVar24);
      uVar7 = vptestmd_avx512f(auVar23,auVar19);
      auVar22 = vpxord_avx512f(auVar21,auVar20);
      bVar1 = (bool)((byte)uVar7 & 1);
      auVar25._0_4_ = (uint)bVar1 * auVar22._0_4_ | (uint)!bVar1 * auVar21._0_4_;
      bVar1 = (bool)((byte)(uVar7 >> 1) & 1);
      auVar25._4_4_ = (uint)bVar1 * auVar22._4_4_ | (uint)!bVar1 * auVar21._4_4_;
      bVar1 = (bool)((byte)(uVar7 >> 2) & 1);
      auVar25._8_4_ = (uint)bVar1 * auVar22._8_4_ | (uint)!bVar1 * auVar21._8_4_;
      bVar1 = (bool)((byte)(uVar7 >> 3) & 1);
      auVar25._12_4_ = (uint)bVar1 * auVar22._12_4_ | (uint)!bVar1 * auVar21._12_4_;
      bVar1 = (bool)((byte)(uVar7 >> 4) & 1);
      auVar25._16_4_ = (uint)bVar1 * auVar22._16_4_ | (uint)!bVar1 * auVar21._16_4_;
      bVar1 = (bool)((byte)(uVar7 >> 5) & 1);
      auVar25._20_4_ = (uint)bVar1 * auVar22._20_4_ | (uint)!bVar1 * auVar21._20_4_;
      bVar1 = (bool)((byte)(uVar7 >> 6) & 1);
      auVar25._24_4_ = (uint)bVar1 * auVar22._24_4_ | (uint)!bVar1 * auVar21._24_4_;
      bVar1 = (bool)((byte)(uVar7 >> 7) & 1);
      auVar25._28_4_ = (uint)bVar1 * auVar22._28_4_ | (uint)!bVar1 * auVar21._28_4_;
      bVar1 = (bool)((byte)(uVar7 >> 8) & 1);
      auVar25._32_4_ = (uint)bVar1 * auVar22._32_4_ | (uint)!bVar1 * auVar21._32_4_;
      bVar1 = (bool)((byte)(uVar7 >> 9) & 1);
      auVar25._36_4_ = (uint)bVar1 * auVar22._36_4_ | (uint)!bVar1 * auVar21._36_4_;
      bVar1 = (bool)((byte)(uVar7 >> 10) & 1);
      auVar25._40_4_ = (uint)bVar1 * auVar22._40_4_ | (uint)!bVar1 * auVar21._40_4_;
      bVar1 = (bool)((byte)(uVar7 >> 0xb) & 1);
      auVar25._44_4_ = (uint)bVar1 * auVar22._44_4_ | (uint)!bVar1 * auVar21._44_4_;
      bVar1 = (bool)((byte)(uVar7 >> 0xc) & 1);
      auVar25._48_4_ = (uint)bVar1 * auVar22._48_4_ | (uint)!bVar1 * auVar21._48_4_;
      bVar1 = (bool)((byte)(uVar7 >> 0xd) & 1);
      auVar25._52_4_ = (uint)bVar1 * auVar22._52_4_ | (uint)!bVar1 * auVar21._52_4_;
      bVar1 = (bool)((byte)(uVar7 >> 0xe) & 1);
      auVar25._56_4_ = (uint)bVar1 * auVar22._56_4_ | (uint)!bVar1 * auVar21._56_4_;
      bVar1 = SUB81(uVar7 >> 0xf,0);
      auVar25._60_4_ = (uint)bVar1 * auVar22._60_4_ | (uint)!bVar1 * auVar21._60_4_;
      auVar21 = vmovdqu32_avx512f(auVar25);
      *(undefined1 (*) [64])(this->x + lVar5) = auVar21;
      lVar5 = lVar5 + 0x10;
    } while (lVar5 != 0xf0);
    lVar5 = 0x354;
    auVar11._8_4_ = 0x7ffffffe;
    auVar11._0_8_ = 0x7ffffffe7ffffffe;
    auVar11._12_4_ = 0x7ffffffe;
    auVar12._8_4_ = 0x80000000;
    auVar12._0_8_ = 0x8000000080000000;
    auVar12._12_4_ = 0x80000000;
    auVar26._8_4_ = 1;
    auVar26._0_8_ = 0x100000001;
    auVar26._12_4_ = 1;
    auVar28._8_4_ = 0x9908b0df;
    auVar28._0_8_ = 0x9908b0df9908b0df;
    auVar28._12_4_ = 0x9908b0df;
    do {
      auVar8 = vpand_avx(*(undefined1 (*) [16])(this->x + lVar5),auVar11);
      auVar8 = vpternlogd_avx512vl(auVar8,auVar12,*(undefined1 (*) [16])(this->x + lVar5 + -1),0xf8)
      ;
      auVar8 = vpsrld_avx(auVar8,1);
      auVar8 = auVar8 ^ *(undefined1 (*) [16])((long)this + lVar5 * 4 + -0xd50);
      uVar7 = vptestmd_avx512vl(*(undefined1 (*) [16])(this->x + lVar5),auVar26);
      uVar7 = uVar7 & 0xf;
      auVar9 = vpxord_avx512vl(auVar8,auVar28);
      bVar1 = (bool)((byte)uVar7 & 1);
      auVar10._0_4_ = (uint)bVar1 * auVar9._0_4_ | (uint)!bVar1 * auVar8._0_4_;
      bVar1 = (bool)((byte)(uVar7 >> 1) & 1);
      auVar10._4_4_ = (uint)bVar1 * auVar9._4_4_ | (uint)!bVar1 * auVar8._4_4_;
      bVar1 = (bool)((byte)(uVar7 >> 2) & 1);
      auVar10._8_4_ = (uint)bVar1 * auVar9._8_4_ | (uint)!bVar1 * auVar8._8_4_;
      bVar1 = SUB81(uVar7 >> 3,0);
      auVar10._12_4_ = (uint)bVar1 * auVar9._12_4_ | (uint)!bVar1 * auVar8._12_4_;
      *(undefined1 (*) [16])((long)this + lVar5 * 4 + -0x9c4) = auVar10;
      lVar5 = lVar5 + 4;
    } while (lVar5 != 0x4e0);
    this->x[0x26f] =
         -(this->x[0] & 1) & 0x9908b0df ^
         (this->x[0] & 0x7ffffffe | this->x[0x4df] & 0x80000000) >> 1 ^ this->x[0x18c];
    this->i = 0;
    return;
  }
  return;
}

Assistant:

void mersenne_twister<UIntType,w,n,m,r,a,u,s,b,t,c,l,val>::twist(
            int block
        )
        {
            const UIntType upper_mask = (~0u) << r;
            const UIntType lower_mask = ~upper_mask;

            if(block == 0) {
                for(int j = n; j < 2*n; j++) {
                    UIntType y = (x[j-n] & upper_mask) | (x[j-(n-1)] & lower_mask);
                    x[j] = x[j-(n-m)] ^ (y >> 1) ^ (y&1 ? a : 0);
                }
            } else if (block == 1) {
                // split loop to avoid costly modulo operations
                {  // extra scope for MSVC brokenness w.r.t. for scope
                    for(int j = 0; j < n-m; j++) {
                        UIntType y = (x[j+n] & upper_mask) | (x[j+n+1] & lower_mask);
                        x[j] = x[j+n+m] ^ (y >> 1) ^ (y&1 ? a : 0);
                    }
                }

                for(int j = n-m; j < n-1; j++) {
                    UIntType y = (x[j+n] & upper_mask) | (x[j+n+1] & lower_mask);
                    x[j] = x[j-(n-m)] ^ (y >> 1) ^ (y&1 ? a : 0);
                }
                // last iteration
                UIntType y = (x[2*n-1] & upper_mask) | (x[0] & lower_mask);
                x[n-1] = x[m-1] ^ (y >> 1) ^ (y&1 ? a : 0);
                i = 0;
            }
        }